

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

LoopBreakLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_loopbreak(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x26c) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x26c;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    LoopBreakLayerParams::LoopBreakLayerParams(this_00.loopbreak_);
    (this->layer_).loopbreak_ = (LoopBreakLayerParams *)this_00;
  }
  return (LoopBreakLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::LoopBreakLayerParams* NeuralNetworkLayer::mutable_loopbreak() {
  if (!has_loopbreak()) {
    clear_layer();
    set_has_loopbreak();
    layer_.loopbreak_ = new ::CoreML::Specification::LoopBreakLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.loopBreak)
  return layer_.loopbreak_;
}